

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.h
# Opt level: O2

bool __thiscall JsArrayKills::KillsValueType(JsArrayKills *this,ValueType valueType)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined4 *puVar4;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a [4];
  ValueType valueType_local;
  
  local_1a[0] = valueType.field_0;
  bVar2 = ValueType::IsArrayOrObjectWithArray((ValueType *)&local_1a[0].field_0);
  if ((!bVar2) &&
     (bVar2 = ValueType::IsOptimizedVirtualTypedArray((ValueType *)&local_1a[0].field_0), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.h"
                       ,0x16a,
                       "(valueType.IsArrayOrObjectWithArray() || valueType.IsOptimizedVirtualTypedArray())"
                       ,
                       "valueType.IsArrayOrObjectWithArray() || valueType.IsOptimizedVirtualTypedArray()"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar2 = true;
  if (((this->field_0).bits & 1) == 0) {
    bVar2 = ValueType::IsArrayOrObjectWithArray((ValueType *)&local_1a[0].field_0);
    if (bVar2) {
      bVar3 = (this->field_0).bits;
      if ((bVar3 & 2) != 0) {
        bVar2 = ValueType::HasNoMissingValues((ValueType *)&local_1a[0].field_0);
        if (bVar2) {
          return true;
        }
        bVar3 = (this->field_0).bits;
      }
      if ((((bVar3 & 4) != 0) &&
          (bVar2 = ValueType::IsArray((ValueType *)&local_1a[0].field_0), !bVar2)) &&
         (bVar2 = ValueType::HasNoMissingValues((ValueType *)&local_1a[0].field_0), bVar2)) {
        return true;
      }
      if (((this->field_0).bits & 8) != 0) {
        bVar2 = ValueType::HasVarElements((ValueType *)&local_1a[0].field_0);
        return !bVar2;
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool KillsValueType(const ValueType valueType) const
    {
        Assert(valueType.IsArrayOrObjectWithArray() || valueType.IsOptimizedVirtualTypedArray());

        return
            killsAllArrays ||
            (valueType.IsArrayOrObjectWithArray() &&
             (
              (killsArraysWithNoMissingValues && valueType.HasNoMissingValues()) ||
              (killsObjectArraysWithNoMissingValues && !valueType.IsArray() && valueType.HasNoMissingValues()) ||
              (killsNativeArrays && !valueType.HasVarElements())
             )
            );
    }